

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::TempDirDeleter::~TempDirDeleter(TempDirDeleter *this)

{
  if ((this->name_)._M_string_length != 0) {
    File::DeleteRecursively(&this->name_,(void *)0x0,(void *)0x0);
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~TempDirDeleter() {
    if (!name_.empty()) {
      File::DeleteRecursively(name_, nullptr, nullptr);
    }
  }